

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall Server::load_module(Server *this,string *module)

{
  bool bVar1;
  undefined8 uVar2;
  mapped_type pvVar3;
  mapped_type *ppvVar4;
  code *pcVar5;
  ModuleLoad module_load;
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  mapped_type local_30;
  void *handle;
  _Self local_20;
  string *local_18;
  string *module_local;
  Server *this_local;
  
  local_18 = module;
  module_local = (string *)this;
  local_20._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(&available_modules_abi_cxx11_,module);
  handle = (void *)std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(&available_modules_abi_cxx11_);
  bVar1 = std::operator!=(&local_20,(_Self *)&handle);
  if (bVar1) {
    std::operator+((char *)local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"libmodule_"
                  );
    std::operator+(local_50,(char *)local_70);
    uVar2 = std::__cxx11::string::c_str();
    pvVar3 = (mapped_type)dlopen(uVar2,2);
    std::__cxx11::string::~string((string *)local_50);
    std::__cxx11::string::~string(local_70);
    local_30 = pvVar3;
    ppvVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
              ::operator[](&this->loaded_modules,module);
    *ppvVar4 = pvVar3;
    pcVar5 = (code *)dlsym(local_30,"module_load");
    (*pcVar5)(this);
  }
  return;
}

Assistant:

void Server::load_module(std::string module) {
    if (available_modules.find(module) != available_modules.end()) {
        auto handle = dlopen(("libmodule_" + module + ".so").c_str(), RTLD_NOW);
        this->loaded_modules[module] = handle;
        auto module_load = (ModuleLoad) dlsym(handle, "module_load");
        module_load(this);
    }
}